

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O1

void __thiscall jpgd::jpeg_decoder::locate_soi_marker(jpeg_decoder *this)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  byte *pbVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  
  iVar9 = this->m_bits_left;
  uVar7 = this->m_bit_buf;
  this->m_bits_left = iVar9 + -8;
  if (iVar9 < 9) {
    this->m_bit_buf = uVar7 << ((byte)iVar9 & 0x1f);
    if ((this->m_in_buf_left == 0) && (prep_in_buffer(this), this->m_in_buf_left == 0)) {
      uVar5 = this->m_tem_flag;
      this->m_tem_flag = uVar5 ^ 1;
      uVar8 = 0xd9;
      if (uVar5 == 0) {
        uVar8 = 0xff;
      }
    }
    else {
      pbVar4 = this->m_pIn_buf_ofs;
      this->m_pIn_buf_ofs = pbVar4 + 1;
      bVar1 = *pbVar4;
      this->m_in_buf_left = this->m_in_buf_left + -1;
      uVar8 = (uint)bVar1;
    }
    if ((this->m_in_buf_left == 0) && (prep_in_buffer(this), this->m_in_buf_left == 0)) {
      uVar6 = this->m_tem_flag;
      this->m_tem_flag = uVar6 ^ 1;
      uVar5 = 0xd9;
      if (uVar6 == 0) {
        uVar5 = 0xff;
      }
    }
    else {
      pbVar4 = this->m_pIn_buf_ofs;
      this->m_pIn_buf_ofs = pbVar4 + 1;
      uVar5 = (uint)*pbVar4;
      this->m_in_buf_left = this->m_in_buf_left + -1;
    }
    this->m_bit_buf =
         (uVar8 << 8 | (uint)*(ushort *)((long)&this->m_bit_buf + 2) << 0x10 | uVar5) <<
         (-(char)this->m_bits_left & 0x1fU);
    this->m_bits_left = this->m_bits_left + 0x10;
  }
  else {
    this->m_bit_buf = uVar7 << 8;
  }
  iVar9 = this->m_bits_left;
  uVar8 = this->m_bit_buf;
  this->m_bits_left = iVar9 + -8;
  if (iVar9 < 9) {
    this->m_bit_buf = uVar8 << ((byte)iVar9 & 0x1f);
    if ((this->m_in_buf_left == 0) && (prep_in_buffer(this), this->m_in_buf_left == 0)) {
      uVar6 = this->m_tem_flag;
      this->m_tem_flag = uVar6 ^ 1;
      uVar5 = 0xd9;
      if (uVar6 == 0) {
        uVar5 = 0xff;
      }
    }
    else {
      pbVar4 = this->m_pIn_buf_ofs;
      this->m_pIn_buf_ofs = pbVar4 + 1;
      bVar1 = *pbVar4;
      this->m_in_buf_left = this->m_in_buf_left + -1;
      uVar5 = (uint)bVar1;
    }
    if ((this->m_in_buf_left == 0) && (prep_in_buffer(this), this->m_in_buf_left == 0)) {
      uVar3 = this->m_tem_flag;
      this->m_tem_flag = uVar3 ^ 1;
      uVar6 = 0xd9;
      if (uVar3 == 0) {
        uVar6 = 0xff;
      }
    }
    else {
      pbVar4 = this->m_pIn_buf_ofs;
      this->m_pIn_buf_ofs = pbVar4 + 1;
      uVar6 = (uint)*pbVar4;
      this->m_in_buf_left = this->m_in_buf_left + -1;
    }
    this->m_bit_buf =
         (uVar5 << 8 | (uint)*(ushort *)((long)&this->m_bit_buf + 2) << 0x10 | uVar6) <<
         (-(char)this->m_bits_left & 0x1fU);
    this->m_bits_left = this->m_bits_left + 0x10;
  }
  else {
    this->m_bit_buf = uVar8 << 8;
  }
  if (0xfeffffff < uVar7 && uVar8 >> 0x18 == 0xd8) {
    return;
  }
  iVar9 = -0xfff;
  uVar7 = uVar8 >> 0x18;
  do {
    iVar2 = this->m_bits_left;
    uVar8 = this->m_bit_buf;
    this->m_bits_left = iVar2 + -8;
    if (iVar2 < 9) {
      this->m_bit_buf = uVar8 << ((byte)iVar2 & 0x1f);
      if ((this->m_in_buf_left == 0) && (prep_in_buffer(this), this->m_in_buf_left == 0)) {
        uVar6 = this->m_tem_flag;
        this->m_tem_flag = uVar6 ^ 1;
        uVar5 = 0xd9;
        if (uVar6 == 0) {
          uVar5 = 0xff;
        }
      }
      else {
        pbVar4 = this->m_pIn_buf_ofs;
        this->m_pIn_buf_ofs = pbVar4 + 1;
        uVar5 = (uint)*pbVar4;
        this->m_in_buf_left = this->m_in_buf_left + -1;
      }
      if ((this->m_in_buf_left == 0) && (prep_in_buffer(this), this->m_in_buf_left == 0)) {
        uVar3 = this->m_tem_flag;
        this->m_tem_flag = uVar3 ^ 1;
        uVar6 = 0xd9;
        if (uVar3 == 0) {
          uVar6 = 0xff;
        }
      }
      else {
        pbVar4 = this->m_pIn_buf_ofs;
        this->m_pIn_buf_ofs = pbVar4 + 1;
        uVar6 = (uint)*pbVar4;
        this->m_in_buf_left = this->m_in_buf_left + -1;
      }
      this->m_bit_buf =
           (uVar5 << 8 | (uint)*(ushort *)((long)&this->m_bit_buf + 2) << 0x10 | uVar6) <<
           (-(char)this->m_bits_left & 0x1fU);
      this->m_bits_left = this->m_bits_left + 0x10;
    }
    else {
      this->m_bit_buf = uVar8 << 8;
    }
    uVar8 = uVar8 >> 0x18;
    if (uVar7 == 0xff) {
      if (uVar8 == 0xd8) {
        if (0xfeffffff < this->m_bit_buf) {
          return;
        }
        break;
      }
      if (uVar8 == 0xd9) break;
    }
    iVar9 = iVar9 + 1;
    uVar7 = uVar8;
  } while (iVar9 != 0);
  stop_decoding(this,JPGD_NOT_JPEG);
}

Assistant:

void jpeg_decoder::locate_soi_marker() {
  uint lastchar, thischar;
  uint bytesleft;

  lastchar = get_bits(8);

  thischar = get_bits(8);

  /* ok if it's a normal JPEG file without a special header */

  if ((lastchar == 0xFF) && (thischar == M_SOI))
    return;

  bytesleft = 4096;  //512;

  for (;;) {
    if (--bytesleft == 0)
      stop_decoding(JPGD_NOT_JPEG);

    lastchar = thischar;

    thischar = get_bits(8);

    if (lastchar == 0xFF) {
      if (thischar == M_SOI)
        break;
      else if (thischar == M_EOI)  // get_bits will keep returning M_EOI if we read past the end
        stop_decoding(JPGD_NOT_JPEG);
    }
  }

  // Check the next character after marker: if it's not 0xFF, it can't be the start of the next marker, so the file is bad.
  thischar = (m_bit_buf >> 24) & 0xFF;

  if (thischar != 0xFF)
    stop_decoding(JPGD_NOT_JPEG);
}